

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O3

void test_useless(void)

{
  Useless four;
  Useless one;
  Useless three;
  Useless two;
  Useless UStack_48;
  Useless local_38;
  Useless local_28;
  Useless local_18;
  
  L18_1::Useless::Useless(&local_38,10,'x');
  L18_1::Useless::Useless(&local_18,&local_38);
  L18_1::Useless::Useless(&local_28,0x14,'o');
  L18_1::Useless::operator+(&UStack_48,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nOne: \n",7);
  L18_1::Useless::showData(&local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nTwo: \n",7);
  L18_1::Useless::showData(&local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nThree: \n",9);
  L18_1::Useless::showData(&local_28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nFour: \n",8);
  L18_1::Useless::showData(&UStack_48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"four = move(one):\n",0x12);
  L18_1::Useless::operator=(&UStack_48,&local_38);
  L18_1::Useless::showData(&UStack_48);
  L18_1::Useless::operator=(&UStack_48,&local_38);
  L18_1::Useless::showData(&UStack_48);
  L18_1::Useless::~Useless(&UStack_48);
  L18_1::Useless::~Useless(&local_28);
  L18_1::Useless::~Useless(&local_18);
  L18_1::Useless::~Useless(&local_38);
  return;
}

Assistant:

void test_useless() {
    using namespace L18_1;
//    using namespace std;

    //  10 x 'x'
    Useless one(10, 'x');
    Useless two = one;  //  calls 'copy constructor'
    Useless three(20, 'o');
    //  first, '+'
    //  then, 'copy constructor?'
    //  the mingw compiler doesn't call 'move constructor', but still transfer ownership of 'temp'...
    Useless four(one + three);

    cout << "\nOne: \n";
    one.showData();
    cout << "\nTwo: \n";
    two.showData();
    cout << "\nThree: \n";
    three.showData();
    cout << "\nFour: \n";
    four.showData();

    //  use std::move
    cout << "four = move(one):\n";
    //  this will call 'copy assignment'
    four = one;
    four.showData();
    //  this will call 'move assignment'
    //  std::move make left-value(one) into right-value
    four = std::move(one);
    four.showData();
}